

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int EXRNumLevels(EXRImage *exr_image)

{
  EXRImage *local_28;
  EXRImage *level_image;
  int levels;
  EXRImage *exr_image_local;
  
  if (exr_image == (EXRImage *)0x0) {
    exr_image_local._4_4_ = 0;
  }
  else if (exr_image->images == (uchar **)0x0) {
    level_image._4_4_ = 1;
    local_28 = exr_image;
    while (local_28 = local_28->next_level, local_28 != (TEXRImage *)0x0) {
      level_image._4_4_ = level_image._4_4_ + 1;
    }
    exr_image_local._4_4_ = level_image._4_4_;
  }
  else {
    exr_image_local._4_4_ = 1;
  }
  return exr_image_local._4_4_;
}

Assistant:

int EXRNumLevels(const EXRImage* exr_image) {
  if (exr_image == NULL) return 0;
  if(exr_image->images) return 1; // scanlines
  int levels = 1;
  const EXRImage* level_image = exr_image;
  while((level_image = level_image->next_level)) ++levels;
  return levels;
}